

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3SnippetAdvance(char **ppIter,i64 *piIter,int iNext)

{
  char *pcVar1;
  i64 iVar2;
  long in_FS_OFFSET;
  i64 iIter;
  char *pIter;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIter = *ppIter;
  if (pIter != (char *)0x0) {
    iIter = *piIter;
    while (pcVar1 = pIter, iVar2 = iIter, iIter < iNext) {
      if ((byte)*pIter < 2) {
        pcVar1 = (char *)0x0;
        iVar2 = -1;
        break;
      }
      fts3GetDeltaPosition(&pIter,&iIter);
    }
    *piIter = iVar2;
    *ppIter = pcVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts3SnippetAdvance(char **ppIter, i64 *piIter, int iNext){
  char *pIter = *ppIter;
  if( pIter ){
    i64 iIter = *piIter;

    while( iIter<iNext ){
      if( 0==(*pIter & 0xFE) ){
        iIter = -1;
        pIter = 0;
        break;
      }
      fts3GetDeltaPosition(&pIter, &iIter);
    }

    *piIter = iIter;
    *ppIter = pIter;
  }
}